

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_ecc_weierstrass_is_identity(void)

{
  WeierstrassCurve *wc;
  WeierstrassPoint *dest;
  size_t sVar1;
  WeierstrassPoint *src;
  size_t sVar2;
  
  wc = wcurve();
  dest = ecc_weierstrass_point_new_identity(wc);
  sVar1 = (*looplimit)(5);
  if (1 < sVar1) {
    sVar1 = 1;
    do {
      src = wpoint(wc,sVar1);
      ecc_weierstrass_point_copy_into(dest,src);
      ecc_weierstrass_point_free(src);
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      ecc_weierstrass_is_identity(dest);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      sVar1 = sVar1 + 1;
      sVar2 = (*looplimit)(5);
    } while (sVar1 < sVar2);
  }
  ecc_weierstrass_point_free(dest);
  ecc_weierstrass_curve_free(wc);
  return;
}

Assistant:

static void test_ecc_weierstrass_is_identity(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    for (size_t i = 1; i < looplimit(5); i++) {
        WeierstrassPoint *A = wpoint(wc, i);
        ecc_weierstrass_point_copy_into(a, A);
        ecc_weierstrass_point_free(A);

        log_start();
        ecc_weierstrass_is_identity(a);
        log_end();
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_curve_free(wc);
}